

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redundancy_elimination.cpp
# Opt level: O0

Status __thiscall spvtools::opt::RedundancyEliminationPass::Process(RedundancyEliminationPass *this)

{
  bool bVar1;
  Status SVar2;
  IRContext *pIVar3;
  Module *this_00;
  reference this_01;
  DominatorAnalysis *this_02;
  DominatorTreeNode *bb;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_130;
  undefined1 local_100 [8];
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  value_to_ids;
  DominatorTree *dom_tree;
  value_type *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  ValueNumberTable vnTable;
  bool modified;
  RedundancyEliminationPass *this_local;
  
  vnTable._127_1_ = 0;
  pIVar3 = Pass::context((Pass *)this);
  ValueNumberTable::ValueNumberTable((ValueNumberTable *)&__range2,pIVar3);
  this_00 = Pass::get_module((Pass *)this);
  join_0x00000010_0x00000000_ = Module::begin(this_00);
  _func = Module::end(this_00);
  while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1) {
    this_01 = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
    bVar1 = opt::Function::IsDeclaration(this_01);
    if (!bVar1) {
      pIVar3 = Pass::context((Pass *)this);
      this_02 = IRContext::GetDominatorAnalysis(pIVar3,this_01);
      value_to_ids._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)DominatorAnalysisBase::GetDomTree(&this_02->super_DominatorAnalysisBase);
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)local_100);
      bb = DominatorTree::GetRoot
                     ((DominatorTree *)value_to_ids._M_t._M_impl.super__Rb_tree_header._M_node_count
                     );
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::map(&local_130,
            (map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)local_100);
      bVar1 = EliminateRedundanciesFrom(this,bb,(ValueNumberTable *)&__range2,&local_130);
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~map(&local_130);
      if (bVar1) {
        vnTable._127_1_ = 1;
      }
      std::
      map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)local_100);
    }
    UptrVectorIterator<spvtools::opt::Function,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
  }
  SVar2 = SuccessWithoutChange;
  if ((vnTable._127_1_ & 1) != 0) {
    SVar2 = SuccessWithChange;
  }
  ValueNumberTable::~ValueNumberTable((ValueNumberTable *)&__range2);
  return SVar2;
}

Assistant:

Pass::Status RedundancyEliminationPass::Process() {
  bool modified = false;
  ValueNumberTable vnTable(context());

  for (auto& func : *get_module()) {
    if (func.IsDeclaration()) {
      continue;
    }

    // Build the dominator tree for this function. It is how the code is
    // traversed.
    DominatorTree& dom_tree =
        context()->GetDominatorAnalysis(&func)->GetDomTree();

    // Keeps track of all ids that contain a given value number. We keep
    // track of multiple values because they could have the same value, but
    // different decorations.
    std::map<uint32_t, uint32_t> value_to_ids;

    if (EliminateRedundanciesFrom(dom_tree.GetRoot(), vnTable, value_to_ids)) {
      modified = true;
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}